

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O3

void __thiscall QGraphicsItemAnimation::setStep(QGraphicsItemAnimation *this,qreal step)

{
  QGraphicsItem *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  QPointF QVar3;
  QTransform local_d0;
  QTransform local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((step < 0.0) || (1.0 < step)) {
    local_80.m_matrix[0][0]._0_4_ = 2;
    local_80.m_matrix[0]._4_8_ = 0;
    local_80.m_matrix[0][1]._4_4_ = 0;
    local_80.m_matrix[0][2]._0_4_ = 0;
    local_80.m_matrix[0][2]._4_4_ = 0;
    local_80.m_matrix[1][0] = 3.3044483896358e-317;
    QMessageLogger::warning
              ((char *)&local_80,"QGraphicsItemAnimation::%s: invalid step = %f","setStep");
  }
  else {
    (**(code **)(*(long *)this + 0x60))();
    lVar2 = *(long *)(this + 0x10);
    *(qreal *)(lVar2 + 0x80) = step;
    pQVar1 = *(QGraphicsItem **)(lVar2 + 0x18);
    if (pQVar1 != (QGraphicsItem *)0x0) {
      if ((*(long *)(lVar2 + 0x98) != 0) || (*(long *)(lVar2 + 0xb0) != 0)) {
        QVar3 = posAt(this,step);
        local_80.m_matrix[0][0]._0_4_ = QVar3.xp._0_4_;
        local_80.m_matrix[0]._4_8_ = QVar3._4_8_;
        local_80.m_matrix[0][1]._4_4_ = QVar3.yp._4_4_;
        QGraphicsItem::setPos(pQVar1,(QPointF *)&local_80);
        lVar2 = *(long *)(this + 0x10);
      }
      if ((((*(long *)(lVar2 + 200) != 0) || (*(long *)(lVar2 + 0xe0) != 0)) ||
          (*(long *)(lVar2 + 0xf8) != 0)) ||
         (((*(long *)(lVar2 + 0x110) != 0 || (*(long *)(lVar2 + 0x128) != 0)) ||
          ((*(long *)(lVar2 + 0x140) != 0 || (*(long *)(lVar2 + 0x158) != 0)))))) {
        pQVar1 = *(QGraphicsItem **)(lVar2 + 0x18);
        transformAt(&local_d0,this,step);
        QTransform::operator*(&local_80,(QTransform *)(lVar2 + 0x30));
        QGraphicsItem::setTransform(pQVar1,&local_80,false);
      }
    }
    (**(code **)(*(long *)this + 0x68))(step,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemAnimation::setStep(qreal step)
{
    if (!check_step_valid(step, "setStep"))
        return;

    beforeAnimationStep(step);

    d->step = step;
    if (d->item) {
        if (!d->xPosition.isEmpty() || !d->yPosition.isEmpty())
            d->item->setPos(posAt(step));
        if (!d->rotation.isEmpty()
            || !d->verticalScale.isEmpty()
            || !d->horizontalScale.isEmpty()
            || !d->verticalShear.isEmpty()
            || !d->horizontalShear.isEmpty()
            || !d->xTranslation.isEmpty()
            || !d->yTranslation.isEmpty()) {
            d->item->setTransform(d->startTransform * transformAt(step));
        }
    }

    afterAnimationStep(step);
}